

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_getRowBounds(HModel *this,int firstrow,int lastrow,double *XrowLower,double *XrowUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int row;
  long lVar4;
  double dVar5;
  
  if (firstrow <= lastrow) {
    pdVar1 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if (XrowLower != (double *)0x0) {
        dVar5 = pdVar3[firstrow + lVar4];
        if (-1e+200 < dVar5) {
          dVar5 = dVar5 * pdVar2[firstrow + lVar4];
        }
        XrowLower[lVar4] = dVar5;
      }
      if (XrowUpper != (double *)0x0) {
        dVar5 = pdVar1[firstrow + lVar4];
        if (dVar5 < 1e+200) {
          dVar5 = dVar5 * pdVar2[firstrow + lVar4];
        }
        XrowUpper[lVar4] = dVar5;
      }
      lVar4 = lVar4 + 1;
    } while ((lastrow - firstrow) + 1 != (int)lVar4);
  }
  return;
}

Assistant:

void HModel::util_getRowBounds(int firstrow, int lastrow, double* XrowLower, double* XrowUpper) {
  assert(0 <= firstrow);
  assert(firstrow <= lastrow);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; ++row) {
    if (XrowLower != NULL)
      XrowLower[row-firstrow] = (hsol_isInfinity(-rowLower[row]) ? rowLower[row]
				 : rowLower[row] * rowScale[row]);
    if (XrowUpper != NULL)
      XrowUpper[row-firstrow] = (hsol_isInfinity(rowUpper[row]) ? rowUpper[row]
				 : rowUpper[row] * rowScale[row]);
  }
}